

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

OPJ_BOOL bmp_read_rle4_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  byte *pbVar1;
  int in_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT8 *pOVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  uint local_54;
  
  if (height != 0) {
    pbVar11 = pData + height * stride;
    uVar7 = 0;
    local_54 = 0;
    pbVar12 = pData;
    do {
      iVar2 = getc((FILE *)IN);
      if (iVar2 == 0) {
        uVar3 = getc((FILE *)IN);
        pOVar5 = (OPJ_UINT8 *)(ulong)(uVar3 + 1);
        if (uVar3 + 1 < 4) {
          in_EAX = (&switchD_0010d43e::switchdataD_00116ec4)[(long)pOVar5] + 0x116ec4;
          switch(pOVar5) {
          default:
            goto switchD_0010d43e_caseD_0;
          case (OPJ_UINT8 *)0x1:
            local_54 = local_54 + 1;
            pOVar5 = (OPJ_UINT8 *)(ulong)local_54;
            pbVar12 = pData + local_54 * stride;
            uVar7 = 0;
            break;
          case (OPJ_UINT8 *)0x3:
            iVar2 = getc((FILE *)IN);
            uVar7 = iVar2 + uVar7;
            iVar2 = getc((FILE *)IN);
            local_54 = local_54 + iVar2;
            pOVar5 = pData + uVar7;
            pbVar12 = pOVar5 + local_54 * stride;
          }
        }
        else {
          if (((0 < (int)uVar3) && (uVar7 < width)) && (pbVar12 < pbVar11)) {
            lVar8 = 1;
            uVar10 = 0;
            pOVar5 = (OPJ_UINT8 *)0x0;
            do {
              if ((uVar10 & 1) == 0) {
                uVar4 = getc((FILE *)IN);
                pOVar5 = (OPJ_UINT8 *)(ulong)uVar4;
              }
              bVar9 = (byte)pOVar5;
              if ((uVar10 & 1) == 0) {
                bVar9 = (byte)((ulong)pOVar5 >> 4);
              }
              pbVar12[uVar10] = bVar9 & 0xf;
              uVar10 = uVar10 + 1;
            } while ((((int)lVar8 < (int)uVar3) && (uVar7 + (int)lVar8 < width)) &&
                    (pbVar1 = pbVar12 + lVar8, lVar8 = lVar8 + 1, pbVar1 < pbVar11));
            uVar7 = uVar7 + (int)uVar10;
            pbVar12 = pbVar12 + uVar10;
          }
          if ((uVar3 & 3) - 1 < 2) {
            uVar3 = getc((FILE *)IN);
            pOVar5 = (OPJ_UINT8 *)(ulong)uVar3;
          }
        }
      }
      else {
        if (iVar2 == -1) {
          return -1;
        }
        uVar3 = getc((FILE *)IN);
        pOVar5 = (OPJ_UINT8 *)(ulong)uVar3;
        if (((0 < iVar2) && (uVar7 < width)) && (pbVar12 < pbVar11)) {
          iVar6 = 1;
          bVar9 = 0;
          do {
            *pbVar12 = (byte)(uVar3 >> (~bVar9 & 4)) & 0xf;
            uVar7 = uVar7 + 1;
            pbVar12 = pbVar12 + 1;
            if ((iVar2 <= iVar6) || (width <= uVar7)) break;
            iVar6 = iVar6 + 1;
            bVar9 = bVar9 + 4;
          } while (pbVar12 < pbVar11);
        }
      }
      in_EAX = (int)pOVar5;
    } while (local_54 < height);
  }
switchD_0010d43e_caseD_0:
  return in_EAX;
}

Assistant:

static OPJ_BOOL bmp_read_rle4_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;
    x = y = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            break;
        }

        if (c) { /* encoded mode */
            int j;
            OPJ_UINT8 c1 = (OPJ_UINT8)getc(IN);

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
            }
        } else { /* absolute mode */
            c = getc(IN);
            if (c == EOF) {
                break;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                y++;
                pix = pData + y * stride;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                x += (OPJ_UINT32)c;
                c = getc(IN);
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 : absolute mode */
                int j;
                OPJ_UINT8 c1 = 0U;

                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    if ((j & 1) == 0) {
                        c1 = (OPJ_UINT8)getc(IN);
                    }
                    *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                }
                if (((c & 3) == 1) || ((c & 3) == 2)) { /* skip padding byte */
                    getc(IN);
                }
            }
        }
    }  /* while(y < height) */
    return OPJ_TRUE;
}